

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_zstd.c
# Opt level: O3

ssize_t zstd_filter_read(archive_read_filter *self,void **p)

{
  undefined8 *puVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  void *pvVar5;
  char *fmt;
  archive_read *a;
  ssize_t avail_in;
  ZSTD_inBuffer in;
  undefined8 local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  void *local_48;
  ulong local_40;
  int64_t local_38;
  
  puVar1 = (undefined8 *)self->data;
  local_68 = puVar1[1];
  local_60 = puVar1[2];
  local_58 = 0;
  if (local_60 != 0) {
    if (*(char *)((long)puVar1 + 0x21) == '\0') {
      while( true ) {
        if (*(char *)(puVar1 + 4) == '\0') {
          uVar3 = ZSTD_initDStream(*puVar1);
          iVar2 = ZSTD_isError(uVar3);
          if (iVar2 != 0) {
            a = self->archive;
            uVar3 = ZSTD_getErrorName(uVar3);
            fmt = "Error initializing zstd decompressor: %s";
            goto LAB_00117954;
          }
        }
        local_48 = __archive_read_filter_ahead(self->upstream,1,(ssize_t *)&local_50);
        if ((long)local_50 < 0) {
          return local_50;
        }
        if (local_48 == (void *)0x0 && local_50 == 0) break;
        local_40 = local_50;
        local_38 = 0;
        lVar4 = ZSTD_decompressStream(*puVar1,&local_68,&local_48);
        iVar2 = ZSTD_isError(lVar4);
        if (iVar2 != 0) {
          a = self->archive;
          uVar3 = ZSTD_getErrorName(lVar4);
          fmt = "Zstd decompression failed: %s";
LAB_00117954:
          archive_set_error(&a->archive,-1,fmt,uVar3);
          return -0x1e;
        }
        __archive_read_filter_consume(self->upstream,local_38);
        *(bool *)(puVar1 + 4) = lVar4 != 0;
        if ((local_60 <= local_58) || (*(char *)((long)puVar1 + 0x21) != '\0')) goto LAB_00117827;
      }
      if (*(char *)(puVar1 + 4) != '\0') {
        archive_set_error(&self->archive->archive,-1,"Truncated zstd input");
        return -0x1e;
      }
      *(undefined1 *)((long)puVar1 + 0x21) = 1;
    }
    else {
      local_58 = 0;
    }
LAB_00117827:
    puVar1[3] = puVar1[3] + local_58;
    if (local_58 != 0) {
      pvVar5 = (void *)puVar1[1];
      goto LAB_0011783c;
    }
  }
  local_58 = 0;
  pvVar5 = (void *)0x0;
LAB_0011783c:
  *p = pvVar5;
  return local_58;
}

Assistant:

static ssize_t
zstd_filter_read(struct archive_read_filter *self, const void **p)
{
	struct private_data *state;
	size_t decompressed;
	ssize_t avail_in;
	ZSTD_outBuffer out;
	ZSTD_inBuffer in;
	size_t ret;

	state = (struct private_data *)self->data;

	out = (ZSTD_outBuffer) { state->out_block, state->out_block_size, 0 };

	/* Try to fill the output buffer. */
	while (out.pos < out.size && !state->eof) {
		if (!state->in_frame) {
			ret = ZSTD_initDStream(state->dstream);
			if (ZSTD_isError(ret)) {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Error initializing zstd decompressor: %s",
				    ZSTD_getErrorName(ret));
				return (ARCHIVE_FATAL);
			}
		}
		in.src = __archive_read_filter_ahead(self->upstream, 1,
		    &avail_in);
		if (avail_in < 0) {
			return avail_in;
		}
		if (in.src == NULL && avail_in == 0) {
			if (!state->in_frame) {
				/* end of stream */
				state->eof = 1;
				break;
			} else {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Truncated zstd input");
				return (ARCHIVE_FATAL);
			}
		}
		in.size = avail_in;
		in.pos = 0;

		{
			ret = ZSTD_decompressStream(state->dstream, &out, &in);

			if (ZSTD_isError(ret)) {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Zstd decompression failed: %s",
				    ZSTD_getErrorName(ret));
				return (ARCHIVE_FATAL);
			}

			/* Decompressor made some progress */
			__archive_read_filter_consume(self->upstream, in.pos);

			/* ret guaranteed to be > 0 if frame isn't done yet */
			state->in_frame = (ret != 0);
		}
	}

	decompressed = out.pos;
	state->total_out += decompressed;
	if (decompressed == 0)
		*p = NULL;
	else
		*p = state->out_block;
	return (decompressed);
}